

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

int pcap_compile(pcap_t *p,bpf_program *program,char *buf,int optimize,bpf_u_int32 mask)

{
  undefined4 uVar1;
  int iVar2;
  YY_BUFFER_STATE b;
  bpf_insn *pbVar3;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  yyscan_t scanner;
  char *xbuf;
  u_int len;
  yyscan_t local_318;
  char *local_310;
  u_int local_304;
  undefined1 local_300 [404];
  undefined1 local_16c [16];
  undefined1 local_15c [16];
  undefined1 local_14c [16];
  int local_13c;
  undefined1 local_138 [8];
  undefined8 auStack_130 [32];
  
  local_318 = (yyscan_t)0x0;
  local_310 = buf;
  if (p->activated == 0) {
    builtin_strncpy(p->errbuf,"not-yet-activated pcap_t passed to pcap_compile",0x30);
LAB_00108e76:
    iVar2 = -1;
    b = (YY_BUFFER_STATE)0x0;
    goto LAB_00108e7a;
  }
  local_300._244_4_ = 0;
  local_300._264_8_ = (addrinfo *)0x0;
  local_300._208_8_ = (block *)0x0;
  local_300._216_4_ = 0;
  memset(local_138,0,0x104);
  local_300._388_16_ = (undefined1  [16])0x0;
  local_16c = (undefined1  [16])0x0;
  local_15c = (undefined1  [16])0x0;
  local_14c = (undefined1  [16])0x0;
  local_13c = 0;
  local_300._200_8_ = p;
  iVar2 = _setjmp((__jmp_buf_tag *)local_300);
  if (iVar2 != 0) {
    if ((addrinfo *)local_300._264_8_ != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)local_300._264_8_);
    }
    goto LAB_00108e76;
  }
  local_300._240_4_ = mask;
  local_300._224_4_ = pcap_snapshot(p);
  if (local_300._224_4_ == 0) {
    builtin_strncpy(p->errbuf,"snaplen of 0 rejects all packets",0x21);
    goto LAB_00108e76;
  }
  iVar2 = pcap_lex_init(&local_318);
  if (iVar2 != 0) {
    piVar4 = __errno_location();
    pcVar5 = pcap_strerror(*piVar4);
    bpf_error((compiler_state_t *)local_300,"can\'t initialize scanner: %s",pcVar5);
  }
  pcVar5 = local_310;
  if (local_310 == (char *)0x0) {
    pcVar5 = "";
  }
  b = pcap__scan_string(pcVar5,local_318);
  pcap_set_extra((compiler_state_t *)local_300,local_318);
  local_300._256_4_ = p->fddipad;
  local_300._228_4_ = pcap_datalink(p);
  local_300._296_4_ = 0;
  local_300._300_4_ = 0;
  local_300._304_4_ = -1;
  local_300._288_4_ = 0;
  local_300._292_4_ = -1;
  local_300._272_4_ = 0;
  local_300._276_4_ = 0;
  local_300._280_4_ = -1;
  local_300._284_4_ = 0;
  local_300._308_4_ = 0;
  local_300._312_4_ = 0;
  local_300._316_4_ = -1;
  local_300._320_4_ = 0;
  local_300._324_4_ = 0;
  local_300._328_4_ = -1;
  local_300._332_4_ = 0;
  local_300._340_4_ = 0xffffffff;
  local_300._344_4_ = 0xffffffff;
  local_300._348_4_ = 0xffffffff;
  local_300._376_4_ = 0xffffffff;
  local_300._336_4_ = 0;
  local_300._352_4_ = 0xffffffff;
  local_300._356_4_ = 0xffffffff;
  local_300._360_4_ = 0xffffffff;
  local_300._364_4_ = 0xffffffff;
  local_300._368_4_ = 0xffffffff;
  local_300._372_4_ = 0xffffffff;
  local_300._248_4_ = 0;
  local_300._252_4_ = 0;
  local_300._232_4_ = local_300._228_4_;
  local_300._236_4_ = local_300._228_4_;
  if ((int)local_300._228_4_ < 99) {
    switch(local_300._228_4_) {
    case 0:
      goto switchD_0010904a_caseD_6c;
    case 1:
      local_300._324_4_ = 0xc;
      local_300._308_8_ = 0xe00000000;
      goto LAB_001094cf;
    case 2:
    case 3:
    case 4:
    case 5:
    case 0xd:
    case 0xe:
    case 0x11:
    case 0x12:
      goto switchD_0010904a_caseD_6a;
    case 6:
      local_300._324_4_ = 0xe;
      break;
    case 7:
      local_300._324_4_ = 2;
      local_300._308_8_ = 0x600000000;
      goto LAB_00109485;
    case 8:
      local_300._324_4_ = 0xffffffff;
      goto LAB_0010935a;
    case 9:
      goto switchD_0010904a_caseD_68;
    case 10:
      local_300._324_4_ = local_300._256_4_ + 0xd;
      break;
    case 0xb:
    case 0x13:
      local_300._324_4_ = 0;
      break;
    case 0xc:
      goto switchD_0010904a_caseD_6b;
    case 0xf:
      local_300._324_4_ = 0xffffffff;
      goto LAB_001091cf;
    case 0x10:
      local_300._324_4_ = 5;
LAB_001091cf:
      local_300._308_8_ = 0x1800000000;
      goto LAB_00109485;
    default:
      if (local_300._228_4_ != 0x32) {
        if (local_300._228_4_ == 0x33) {
          local_300._324_4_ = 6;
          goto LAB_0010933f;
        }
        goto switchD_0010904a_caseD_6a;
      }
      goto switchD_0010904a_caseD_68;
    }
LAB_0010930a:
    local_300._308_8_ = (ulong)(uint)local_300._324_4_ << 0x20;
LAB_00109318:
    local_300._384_4_ = 3;
    local_300._380_4_ = 8;
    goto LAB_001094d6;
  }
  switch(local_300._228_4_) {
  case 0x68:
  case 0xa6:
    goto switchD_0010904a_caseD_68;
  case 0x69:
    goto switchD_0010904a_caseD_69;
  case 0x6a:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x78:
  case 0x79:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x80:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc1:
  case 0xc3:
  case 0xc4:
  case 0xc6:
  case 199:
  case 0xc9:
    goto switchD_0010904a_caseD_6a;
  case 0x6b:
  case 0x72:
switchD_0010904a_caseD_6b:
    local_300._324_4_ = 0xffffffff;
    local_300._308_8_ = 0;
    break;
  case 0x6c:
switchD_0010904a_caseD_6c:
    local_300._324_4_ = 0;
    goto LAB_0010947a;
  case 0x6d:
    local_300._324_4_ = 0;
    local_300._308_8_ = 0xc00000000;
    break;
  case 0x71:
    local_300._324_4_ = 0xe;
LAB_0010935a:
    local_300._308_8_ = 0x1000000000;
    break;
  case 0x77:
  case 0x7f:
  case 0xa3:
    local_300._272_4_ = 1;
    local_300._276_4_ = 0;
    goto switchD_0010904a_caseD_69;
  case 0x7a:
    local_300._324_4_ = 0x10;
    goto LAB_0010930a;
  case 0x7b:
    local_300._328_4_ = -1;
    local_300._332_4_ = 1;
    local_300._340_4_ = 1;
    local_300._344_4_ = 2;
    local_300._348_4_ = 0;
    local_300._324_4_ = 4;
    local_300._376_4_ = 4;
    goto LAB_0010930a;
  case 0x81:
    local_300._324_4_ = 4;
LAB_0010933f:
    local_300._308_8_ = 0x800000000;
    break;
  case 0x82:
  case 0x83:
  case 0x86:
  case 0xb3:
  case 0xb4:
  case 0xb5:
    local_300._324_4_ = 4;
    goto LAB_00109051;
  case 0x84:
    local_300._324_4_ = 6;
    goto LAB_001093ab;
  case 0x85:
    local_300._324_4_ = 6;
    local_300._308_8_ = 0xc00000000;
    goto LAB_0010905f;
  case 0x87:
    local_300._324_4_ = 8;
    goto LAB_001093c5;
  case 0x88:
    local_300._324_4_ = 0xc;
    goto LAB_001093ab;
  case 0x89:
    local_300._324_4_ = 4;
LAB_001093c5:
    local_300._308_8_ = (ulong)(uint)local_300._324_4_ << 0x20;
    local_300._384_4_ = 10;
    goto LAB_001094d4;
  case 0x8a:
    local_300._324_4_ = 0x10;
    local_300._308_8_ = 0x1200000000;
    break;
  case 0x8b:
    local_300._352_4_ = 6;
    local_300._356_4_ = 8;
    local_300._360_4_ = 7;
    local_300._364_4_ = 8;
    local_300._368_4_ = 8;
    local_300._372_4_ = 0xb;
    goto switchD_0010904a_caseD_a5;
  case 0x8c:
    local_300._352_4_ = 2;
    local_300._356_4_ = 4;
    local_300._360_4_ = 3;
    local_300._364_4_ = 4;
    local_300._368_4_ = 4;
    local_300._372_4_ = 7;
    goto switchD_0010904a_caseD_a5;
  case 0xa4:
    local_300._324_4_ = 0xc;
LAB_00109051:
    local_300._308_8_ = (ulong)(uint)local_300._324_4_ << 0x20;
    goto LAB_0010905f;
  case 0xa5:
  case 0xca:
    goto switchD_0010904a_caseD_a5;
  case 0xa7:
  case 0xb2:
    local_300._308_8_ = 0xe00000000;
    local_300._324_4_ = 0x10;
    local_300._384_4_ = 0x15;
    local_300._380_4_ = 0x12;
    goto LAB_001094d6;
  case 0xa8:
    local_300._324_4_ = 4;
    local_300._308_8_ = 0x600000000;
LAB_0010905f:
    local_300._384_4_ = 0xffffffff;
LAB_001094d4:
    local_300._380_4_ = 0;
    goto LAB_001094d6;
  case 0xb6:
    local_300._324_4_ = 0xffffffff;
    local_300._308_8_ = 0;
    local_300._384_4_ = 0;
    local_300._380_4_ = 4;
    goto LAB_001094d6;
  case 0xb7:
  case 200:
    local_300._324_4_ = 0x12;
    goto LAB_001093ab;
  case 0xc0:
    local_300._324_4_ = 0x18;
    local_300._308_8_ = 1;
    local_300._272_4_ = 1;
    local_300._276_4_ = 0;
    goto LAB_00109318;
  case 0xc2:
switchD_0010904a_caseD_c2:
    local_300._324_4_ = 8;
LAB_001093ab:
    local_300._308_8_ = -0x100000000;
    local_300._384_4_ = 0xffffffff;
    local_300._380_4_ = local_300._384_4_;
    goto LAB_001094d6;
  case 0xc5:
    local_300._352_4_ = 0x16;
    local_300._356_4_ = 0x18;
    local_300._360_4_ = 0x17;
    local_300._364_4_ = 0x18;
    local_300._368_4_ = 0x18;
    local_300._372_4_ = 0x1b;
    goto switchD_0010904a_caseD_a5;
  default:
    switch(local_300._228_4_) {
    case 0xe2:
      local_300._324_4_ = 1;
      local_300._308_8_ = 0x1800000000;
      goto LAB_0010905f;
    case 0xe4:
    case 0xe5:
      goto switchD_0010904a_caseD_6b;
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xee:
      goto switchD_0010904a_caseD_c2;
    case 0xf0:
      local_300._272_4_ = 0;
      local_300._276_4_ = 4;
      local_300._324_4_ = 0x10;
      local_300._308_8_ = 0x1200000000;
      goto LAB_001094cf;
    case 0xf1:
      local_300._272_4_ = 0;
      local_300._276_4_ = 0xc;
      local_300._324_4_ = 0x18;
      local_300._308_8_ = 0x1a00000000;
LAB_001094cf:
      local_300._384_4_ = 3;
      goto LAB_001094d4;
    case 0xf6:
      local_300._324_4_ = 0xffffffff;
      goto LAB_0010947a;
    default:
      if (local_300._228_4_ == 99) {
        local_300._324_4_ = 6;
        local_300._308_8_ = 0x2c00000000;
        goto LAB_00109485;
      }
    case 0xe3:
    case 0xe6:
    case 0xe7:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xef:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
switchD_0010904a_caseD_6a:
      if (0xa0 < local_300._228_4_ - 0x68) {
        bpf_error((compiler_state_t *)local_300,"unknown data link type %d",
                  (ulong)(uint)local_300._228_4_);
      }
    }
switchD_0010904a_caseD_a5:
    local_300._384_4_ = 0xffffffff;
    local_300._324_4_ = 0xffffffff;
    local_300._308_8_ = -0x100000000;
    local_300._380_4_ = local_300._384_4_;
    goto LAB_001094d6;
  }
LAB_00109485:
  local_300._384_4_ = 0;
  local_300._380_4_ = local_300._384_4_;
LAB_001094d6:
  local_300._292_4_ = -1;
  local_300._284_4_ = (undefined4)local_300._272_8_;
  local_300._288_4_ = SUB84(local_300._272_8_,4);
  local_300._304_4_ = -1;
  local_300._296_8_ = local_300._272_8_;
  pcap_parse(local_318,(compiler_state_t *)local_300);
  uVar1 = local_300._224_4_;
  if ((block *)local_300._208_8_ == (block *)0x0) {
    local_300._208_8_ = newchunk((compiler_state_t *)local_300,0x120);
    (((block *)local_300._208_8_)->s).code = 6;
    ((block *)local_300._208_8_)->head = (block *)local_300._208_8_;
    (((block *)local_300._208_8_)->s).k = uVar1;
  }
  if (((optimize != 0) && (local_300._244_4_ == 0)) &&
     ((bpf_optimize((compiler_state_t *)local_300,(icode *)(local_300 + 0xd0)),
      (block *)local_300._208_8_ == (block *)0x0 ||
      ((((stmt *)(local_300._208_8_ + 0x10))->code == 6 &&
       (((stmt *)(local_300._208_8_ + 0x10))->k == 0)))))) {
    bpf_error((compiler_state_t *)local_300,"expression rejects all packets");
  }
  pbVar3 = icode_to_fcode((compiler_state_t *)local_300,(icode *)(local_300 + 0xd0),
                          (block *)local_300._208_8_,&local_304);
  program->bf_insns = pbVar3;
  program->bf_len = local_304;
  iVar2 = 0;
LAB_00108e7a:
  if (b != (YY_BUFFER_STATE)0x0) {
    pcap__delete_buffer(b,local_318);
  }
  if (local_318 != (yyscan_t)0x0) {
    pcap_lex_destroy(local_318);
  }
  lVar6 = 0x1d0;
  do {
    if (*(void **)(local_300 + lVar6) != (void *)0x0) {
      free(*(void **)(local_300 + lVar6));
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x2d0);
  return iVar2;
switchD_0010904a_caseD_69:
  local_300._324_4_ = 0x18;
  local_300._308_8_ = 1;
  goto LAB_00109318;
switchD_0010904a_caseD_68:
  local_300._324_4_ = 2;
LAB_0010947a:
  local_300._308_8_ = 0x400000000;
  goto LAB_00109485;
}

Assistant:

int
pcap_compile(pcap_t *p, struct bpf_program *program,
	     const char *buf, int optimize, bpf_u_int32 mask)
{
	compiler_state_t cstate;
	const char * volatile xbuf = buf;
	yyscan_t scanner = NULL;
	YY_BUFFER_STATE in_buffer = NULL;
	u_int len;
	int  rc;

#ifdef _WIN32
	static int done = 0;

	if (!done)
		pcap_wsockinit();
	done = 1;
#endif

	/*
	 * If this pcap_t hasn't been activated, it doesn't have a
	 * link-layer type, so we can't use it.
	 */
	if (!p->activated) {
		pcap_snprintf(p->errbuf, PCAP_ERRBUF_SIZE,
		    "not-yet-activated pcap_t passed to pcap_compile");
		rc = -1;
		goto quit;
	}
	initchunks(&cstate);
	cstate.no_optimize = 0;
	cstate.ai = NULL;
	cstate.ic.root = NULL;
	cstate.ic.cur_mark = 0;
	cstate.bpf_pcap = p;
	init_regs(&cstate);

	if (setjmp(cstate.top_ctx)) {
#ifdef INET6
		if (cstate.ai != NULL)
			freeaddrinfo(cstate.ai);
#endif
		rc = -1;
		goto quit;
	}

	cstate.netmask = mask;

	cstate.snaplen = pcap_snapshot(p);
	if (cstate.snaplen == 0) {
		pcap_snprintf(p->errbuf, PCAP_ERRBUF_SIZE,
			 "snaplen of 0 rejects all packets");
		rc = -1;
		goto quit;
	}

	if (pcap_lex_init(&scanner) != 0)
		bpf_error(&cstate, "can't initialize scanner: %s", pcap_strerror(errno));
	in_buffer = pcap__scan_string(xbuf ? xbuf : "", scanner);

	/*
	 * Associate the compiler state with the lexical analyzer
	 * state.
	 */
	pcap_set_extra(&cstate, scanner);

	init_linktype(&cstate, p);
	(void)pcap_parse(scanner, &cstate);

	if (cstate.ic.root == NULL)
		cstate.ic.root = gen_retblk(&cstate, cstate.snaplen);

	if (optimize && !cstate.no_optimize) {
		bpf_optimize(&cstate, &cstate.ic);
		if (cstate.ic.root == NULL ||
		    (cstate.ic.root->s.code == (BPF_RET|BPF_K) && cstate.ic.root->s.k == 0))
			bpf_error(&cstate, "expression rejects all packets");
	}
	program->bf_insns = icode_to_fcode(&cstate, &cstate.ic, cstate.ic.root, &len);
	program->bf_len = len;

	rc = 0;  /* We're all okay */

quit:
	/*
	 * Clean up everything for the lexical analyzer.
	 */
	if (in_buffer != NULL)
		pcap__delete_buffer(in_buffer, scanner);
	if (scanner != NULL)
		pcap_lex_destroy(scanner);

	/*
	 * Clean up our own allocated memory.
	 */
	freechunks(&cstate);

	return (rc);
}